

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wave.cpp
# Opt level: O1

void __thiscall Wave::print_clusters(Wave *this,ofstream *out,string *filename)

{
  pointer pPVar1;
  undefined8 uVar2;
  Wave *pWVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  ostream *poVar9;
  size_type *psVar10;
  long *plVar11;
  pointer pPVar12;
  long lVar13;
  pointer pCVar14;
  long lVar15;
  Cluster g;
  string filename_gnu;
  Point p;
  string arrow_name;
  vector<double,_std::allocator<double>_> values;
  ofstream out_gnu;
  ofstream out_arrow;
  undefined1 local_4e8 [24];
  long lStack_4d0;
  ofstream *local_4c8;
  long *local_4c0;
  long local_4b8;
  long local_4b0;
  long lStack_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  vector<double,_std::allocator<double>_> local_460;
  Wave *local_448;
  long local_440;
  ulong local_438;
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_4c8 = out;
  std::ofstream::ofstream(&local_430);
  std::ofstream::ofstream(&local_230);
  std::__cxx11::string::rfind((char)filename,0x2e);
  std::__cxx11::string::substr((ulong)&local_4c0,(ulong)filename);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4c0);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_480.field_2._M_allocated_capacity = *psVar10;
    local_480.field_2._8_8_ = plVar8[3];
  }
  else {
    local_480.field_2._M_allocated_capacity = *psVar10;
    local_480._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_480._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0,local_4b0 + 1);
  }
  std::__cxx11::string::rfind((char)filename,0x2e);
  std::__cxx11::string::substr((ulong)local_4e8,(ulong)filename);
  plVar8 = (long *)std::__cxx11::string::append(local_4e8);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_4b0 = *plVar11;
    lStack_4a8 = plVar8[3];
    local_4c0 = &local_4b0;
  }
  else {
    local_4b0 = *plVar11;
    local_4c0 = (long *)*plVar8;
  }
  local_4b8 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pPVar1 = (pointer)(local_4e8 + 0x10);
  if ((pointer)local_4e8._0_8_ != pPVar1) {
    operator_delete((void *)local_4e8._0_8_,(ulong)((long)(double *)local_4e8._16_8_ + 1));
  }
  std::ofstream::open((string *)&local_430,(_Ios_Openmode)&local_4c0);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_480);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_430,"rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)",0x33);
  std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
  std::ostream::put((char)&local_430);
  std::ostream::flush();
  std::operator+(&local_4a0,"plot \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",filename);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  pPVar12 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pPVar12) {
    local_4e8._16_8_ = pPVar12->eps;
    lStack_4d0 = plVar8[3];
    local_4e8._0_8_ = pPVar1;
  }
  else {
    local_4e8._16_8_ = pPVar12->eps;
    local_4e8._0_8_ = (pointer)*plVar8;
  }
  local_4e8._8_8_ = plVar8[1];
  *plVar8 = (long)pPVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_430,(char *)local_4e8._0_8_,local_4e8._8_8_);
  if ((pointer)local_4e8._0_8_ != pPVar1) {
    operator_delete((void *)local_4e8._0_8_,(ulong)((long)(double *)local_4e8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_4a0," \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",&local_480);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  pPVar12 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pPVar12) {
    local_4e8._16_8_ = pPVar12->eps;
    lStack_4d0 = plVar8[3];
    local_4e8._0_8_ = pPVar1;
  }
  else {
    local_4e8._16_8_ = pPVar12->eps;
    local_4e8._0_8_ = (pointer)*plVar8;
  }
  local_4e8._8_8_ = plVar8[1];
  *plVar8 = (long)pPVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_430,(char *)local_4e8._0_8_,local_4e8._8_8_);
  if ((pointer)local_4e8._0_8_ != pPVar1) {
    operator_delete((void *)local_4e8._0_8_,(ulong)((long)(double *)local_4e8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::open((string *)local_4c8,(_Ios_Openmode)filename);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Errors in opening",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  else {
    pCVar14 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->clusters).
                                super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pCVar14) >> 3) *
            -0x55555555) {
      lVar15 = 0;
      lVar13 = 0;
      do {
        if (10 < (ulong)((*(long *)((long)&(pCVar14->points).
                                           super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                   + lVar15 + 8) -
                          *(long *)((long)&(pCVar14->points).
                                           super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                   + lVar15) >> 3) * -0x5555555555555555)) {
          std::vector<Point,_std::allocator<Point>_>::vector
                    ((vector<Point,_std::allocator<Point>_> *)local_4e8,
                     (vector<Point,_std::allocator<Point>_> *)
                     ((long)&(pCVar14->points).super__Vector_base<Point,_std::allocator<Point>_>.
                             _M_impl + lVar15));
          Cluster::find_mass_centre((Point *)&local_4a0,(Cluster *)local_4e8);
          Cluster::find_vectors(&local_460,(Cluster *)local_4e8);
          poVar9 = std::ostream::_M_insert<double>((double)local_4a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          poVar9 = std::ostream::_M_insert<double>((double)local_4a0.field_2._M_allocated_capacity);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          poVar9 = std::ostream::_M_insert<double>
                             (*local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          poVar9 = std::ostream::_M_insert<double>
                             (local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[1]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          poVar9 = std::ostream::_M_insert<double>((double)local_4a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          poVar9 = std::ostream::_M_insert<double>((double)local_4a0.field_2._M_allocated_capacity);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          poVar9 = std::ostream::_M_insert<double>
                             (local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          poVar9 = std::ostream::_M_insert<double>
                             (local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[3]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if (local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (double *)0x0) {
            operator_delete(local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_460.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_460.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((pointer)local_4e8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ - local_4e8._0_8_);
          }
        }
        lVar13 = lVar13 + 1;
        pCVar14 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar15 = lVar15 + 0x18;
      } while (lVar13 < (int)((ulong)((long)(this->clusters).
                                            super__Vector_base<Cluster,_std::allocator<Cluster>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)pCVar14) >> 3) * -0x55555555);
    }
    if (0 < (int)((ulong)((long)(this->clusters).
                                super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->clusters).
                               super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
      lVar13 = 0;
      local_448 = this;
      do {
        pWVar3 = local_448;
        iVar5 = rand();
        iVar6 = rand();
        iVar7 = rand();
        std::vector<Point,_std::allocator<Point>_>::vector
                  ((vector<Point,_std::allocator<Point>_> *)local_4e8,
                   &(pWVar3->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar13].points);
        local_440 = lVar13;
        if (0 < (int)((ulong)(local_4e8._8_8_ - local_4e8._0_8_) >> 3) * -0x55555555) {
          local_438 = (ulong)(uint)(iVar5 % 0x101);
          lVar13 = 0;
          lVar15 = 0;
          do {
            poVar9 = std::ostream::_M_insert<double>
                               (*(double *)((long)(local_4e8._0_8_ + 8) + lVar13));
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            poVar9 = std::ostream::_M_insert<double>
                               (*(double *)((long)(local_4e8._0_8_ + 0x10) + lVar13));
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_438);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6 % 0x101);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7 % 0x101);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            lVar15 = lVar15 + 1;
            lVar13 = lVar13 + 0x18;
          } while (lVar15 < (int)((ulong)(local_4e8._8_8_ - local_4e8._0_8_) >> 3) * -0x55555555);
        }
        if ((pointer)local_4e8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ - local_4e8._0_8_);
        }
        lVar13 = local_440 + 1;
      } while (lVar13 < (int)((ulong)((long)(local_448->clusters).
                                            super__Vector_base<Cluster,_std::allocator<Cluster>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(local_448->clusters).
                                           super__Vector_base<Cluster,_std::allocator<Cluster>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x55555555);
    }
  }
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0,local_4b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  uVar2 = _memcpy;
  lVar13 = _VTT;
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  local_430 = lVar13;
  *(undefined8 *)(local_428 + *(long *)(lVar13 + -0x18) + -8) = uVar2;
  std::filebuf::~filebuf(local_428);
  std::ios_base::~ios_base(aiStack_338);
  return;
}

Assistant:

void Wave::print_clusters(ofstream &out,string filename) {
        ofstream out_gnu;
        ofstream out_arrow;
        string arrow_name=filename.substr(0, filename.find_last_of('.')) + "_arrow";
        string filename_gnu = filename.substr(0, filename.find_last_of('.')) + "_gnu.plt";
        out_gnu.open(filename_gnu);
        out_arrow.open(arrow_name);
        out_gnu << "rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)" << endl;

        out_gnu << "plot '/Users/AlinaArslanova/untitled1/cmake-build-debug/" + filename +
                   "' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable, ";
        out_gnu
                << " '/Users/AlinaArslanova/untitled1/cmake-build-debug/"+arrow_name+"' using 1:2:3:4 with vectors head filled  lw 2  lc rgb \"red\"";
        out.open(filename);
        //log("printing clusters to " + filename);


        int a, b, c;
    if (!out.is_open()) {
        cout << "Errors in opening" << endl;
    } else {

        for (int i = 0; i < (int) clusters.size(); i++) {
            if (clusters[i].points.size() > 10) {

                Cluster g = clusters[i];
                Point p=g.find_mass_centre();
                vector<double> values=g.find_vectors();
                out_arrow << p.x << " " << p.y<< " "<<values[0] << " "<<values[1]<< endl;
                out_arrow << p.x << " " << p.y<< " "<<values[2] << " "<<values[3]<< endl;

            }
        }

        for (int i = 0; i < (int) clusters.size(); i++) {

            a = rand() % 257;
            b = rand() % 257;
            c = rand() % 257;
            Cluster g = clusters[i];
            for (int j = 0; j < (int) g.points.size(); j++) {

                out << g.points[j].x << " " << g.points[j].y << " " << a << " " << b << " " << c << " " << endl;
            }


        }


    }
    out.close();
    out_arrow.close();
    out_gnu.close();

}